

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O2

void testAttrPreview(string *tempdir)

{
  exr_result_t eVar1;
  exr_context_t ctxt;
  void *pvVar2;
  char *pcVar3;
  ostream *poVar4;
  char *pcVar5;
  char *in_RCX;
  uint8_t local_3c [4];
  exr_attr_preview_t p;
  exr_context_t f;
  
  ctxt = createDummyFile("<preview>");
  local_3c[0] = 0xde;
  local_3c[1] = 0xad;
  local_3c[2] = 0xbe;
  local_3c[3] = 0xef;
  f = ctxt;
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    eVar1 = (*ctxt->report_error)(ctxt,3,"Invalid reference to preview object to initialize");
    if (eVar1 == 3) {
      pcVar3 = (char *)0xffffffffffffffff;
      eVar1 = (*ctxt->print_error)
                        (ctxt,3,"Invalid very large size for preview image (%u x %u - %lu bytes)",
                         0xffffffffffffffff,0x40,0xffffffff00);
      if (eVar1 != 3) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar1);
        poVar4 = std::operator<<(poVar4,") ");
        pcVar5 = (char *)exr_get_default_error_message(eVar1);
        poVar4 = std::operator<<(poVar4,pcVar5);
        poVar4 = std::operator<<(poVar4,"\n    expected: (");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
        poVar4 = std::operator<<(poVar4,") ");
        pcVar5 = (char *)exr_get_default_error_message(3);
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar4);
        core_test_fail("exr_attr_preview_init (f, &p, (uint32_t) -1, 64)",(char *)0x32e,0x31b351,
                       pcVar3);
      }
      pcVar3 = (char *)0x40;
      eVar1 = (*ctxt->print_error)
                        (ctxt,3,"Invalid very large size for preview image (%u x %u - %lu bytes)",
                         0x40,0xffffffffffffffff,0xffffffff00);
      if (eVar1 != 3) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar1);
        poVar4 = std::operator<<(poVar4,") ");
        pcVar5 = (char *)exr_get_default_error_message(eVar1);
        poVar4 = std::operator<<(poVar4,pcVar5);
        poVar4 = std::operator<<(poVar4,"\n    expected: (");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
        poVar4 = std::operator<<(poVar4,") ");
        pcVar5 = (char *)exr_get_default_error_message(3);
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar4);
        core_test_fail("exr_attr_preview_init (f, &p, 64, (uint32_t) -1)",(char *)0x331,0x31b351,
                       pcVar3);
      }
      pvVar2 = (*ctxt->alloc_fn)(4);
      if (pvVar2 == (void *)0x0) {
        eVar1 = (*ctxt->standard_error)(ctxt,1);
        if (eVar1 != 0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar1);
          poVar4 = std::operator<<(poVar4,") ");
          pcVar5 = (char *)exr_get_default_error_message(eVar1);
          poVar4 = std::operator<<(poVar4,pcVar5);
          std::endl<char,std::char_traits<char>>(poVar4);
          core_test_fail("exr_attr_preview_init (f, &p, 1, 1)",(char *)0x332,0x31b351,pcVar3);
        }
        core_test_fail("p.width == 1",(char *)0x333,0x31b351,pcVar3);
      }
      (*ctxt->free_fn)(pvVar2);
      s_malloc_fail_on = 1;
      p.width = 0;
      p.height = 0;
      p.alloc_size = 0;
      p.rgba = (uint8_t *)(*ctxt->alloc_fn)(4);
      if (p.rgba == (uint8_t *)0x0) {
        eVar1 = (*ctxt->standard_error)(ctxt,1);
        s_malloc_fail_on = 0;
        if (eVar1 == 1) {
          pcVar3 = (char *)0x1;
          eVar1 = exr_attr_preview_create(ctxt,&p,1,1,local_3c);
          if (eVar1 != 0) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar1);
            poVar4 = std::operator<<(poVar4,") ");
            pcVar5 = (char *)exr_get_default_error_message(eVar1);
            poVar4 = std::operator<<(poVar4,pcVar5);
            std::endl<char,std::char_traits<char>>(poVar4);
            core_test_fail("exr_attr_preview_create (f, &p, 1, 1, data1x1)",(char *)0x33f,0x31b351,
                           pcVar3);
          }
          if (p.width != 1) {
            core_test_fail("p.width == 1",(char *)0x340,0x31b351,pcVar3);
          }
          if (p.height != 1) {
            core_test_fail("p.height == 1",(char *)0x341,0x31b351,pcVar3);
          }
          if (p.alloc_size != 4) {
            core_test_fail("p.alloc_size == 4",(char *)0x342,0x31b351,pcVar3);
          }
          if (p.rgba == (uint8_t *)0x0) {
            core_test_fail("p.rgba != __null",(char *)0x343,0x31b351,pcVar3);
          }
          if (*p.rgba != 0xde) {
            core_test_fail("p.rgba[0] == 0xDE",(char *)0x344,0x31b351,pcVar3);
          }
          if (p.rgba[1] != 0xad) {
            core_test_fail("p.rgba[1] == 0xAD",(char *)0x345,0x31b351,pcVar3);
          }
          if (p.rgba[2] != 0xbe) {
            core_test_fail("p.rgba[2] == 0xBE",(char *)0x346,0x31b351,pcVar3);
          }
          if (p.rgba[3] != 0xef) {
            core_test_fail("p.rgba[3] == 0xEF",(char *)0x347,0x31b351,pcVar3);
          }
          (*ctxt->free_fn)(p.rgba);
          p.width = 0;
          p.height = 0;
          p.alloc_size = 0;
          p.rgba = (uint8_t *)0x0;
          s_malloc_fail_on = 1;
          pcVar3 = (char *)0x1;
          eVar1 = exr_attr_preview_create(ctxt,&p,1,1,local_3c);
          s_malloc_fail_on = 0;
          if (eVar1 != 1) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar1);
            poVar4 = std::operator<<(poVar4,") ");
            pcVar5 = (char *)exr_get_default_error_message(eVar1);
            poVar4 = std::operator<<(poVar4,pcVar5);
            poVar4 = std::operator<<(poVar4,"\n    expected: (");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
            poVar4 = std::operator<<(poVar4,") ");
            pcVar5 = (char *)exr_get_default_error_message(1);
            poVar4 = std::operator<<(poVar4,pcVar5);
            std::endl<char,std::char_traits<char>>(poVar4);
            core_test_fail("exr_attr_preview_create (f, &p, 1, 1, data1x1)",(char *)0x34d,0x31b351,
                           pcVar3);
          }
          exr_print_context_info(ctxt,0);
          exr_print_context_info(ctxt,1);
          exr_finish(&f);
          return;
        }
      }
      else {
        eVar1 = 0;
      }
      s_malloc_fail_on = 0;
      poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar1);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar5 = (char *)exr_get_default_error_message(eVar1);
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4,"\n    expected: (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
      poVar4 = std::operator<<(poVar4,") ");
      pcVar5 = (char *)exr_get_default_error_message(1);
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::endl<char,std::char_traits<char>>(poVar4);
      core_test_fail("exr_attr_preview_init (f, &p, 1, 1)",(char *)0x33d,0x31b351,pcVar3);
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar1);
  poVar4 = std::operator<<(poVar4,") ");
  pcVar3 = (char *)exr_get_default_error_message(eVar1);
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n    expected: (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
  poVar4 = std::operator<<(poVar4,") ");
  pcVar3 = (char *)exr_get_default_error_message(3);
  poVar4 = std::operator<<(poVar4,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar4);
  core_test_fail("exr_attr_preview_init (f, __null, 64, 64)",(char *)0x328,0x31b351,in_RCX);
}

Assistant:

void
testAttrPreview (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testPreviewHelper (NULL);
    exr_context_t f = createDummyFile ("<preview>");
    testPreviewHelper (f);
    exr_print_context_info (f, 0);
    exr_print_context_info (f, 1);
    exr_finish (&f);
}